

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O1

int main(void)

{
  long lVar1;
  char s [10];
  char acStack_14 [4];
  char local_10 [16];
  
  builtin_strncpy(local_10,"xxxxabcde",10);
  set_constraint_handler_s(test_handler);
  lVar1 = 4;
  do {
    acStack_14[lVar1] = local_10[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  local_10[4] = local_10[8];
  if (local_10[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memmove_s.c, line %d - %s\n"
           ,0x4c,"s[0] == \'a\'");
  }
  if (local_10[4] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memmove_s.c, line %d - %s\n"
           ,0x4d,"s[4] == \'e\'");
  }
  if (local_10[5] != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memmove_s.c, line %d - %s\n"
           ,0x4e,"s[5] == \'b\'");
  }
  lVar1 = 4;
  do {
    local_10[lVar1] = acStack_14[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  local_10[8] = local_10[4];
  if (local_10[4] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memmove_s.c, line %d - %s\n"
           ,0x50,"s[4] == \'a\'");
  }
  if (HANDLER_CALLS != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memmove_s.c, line %d - %s\n"
           ,0x52,"HANDLER_CALLS == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxabcde";
    set_constraint_handler_s( test_handler );

    TESTCASE( memmove_s( s, 10, s + 4, 5 ) == 0 );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == 'b' );
    TESTCASE( memmove_s( s + 4, 6, s, 5 ) == 0 );
    TESTCASE( s[4] == 'a' );

    TESTCASE( HANDLER_CALLS == 0 );
#endif
    return TEST_RESULTS;
}